

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

string * __thiscall
XipFile::XipEntry::name_abi_cxx11_(string *__return_storage_ptr__,XipEntry *this,XipFile *xip)

{
  shared_ptr<ReadWriter> local_58;
  undefined1 local_48 [8];
  ReadWriter_ptr r;
  XipFile *local_20;
  XipFile *xip_local;
  XipEntry *this_local;
  
  local_20 = xip;
  xip_local = (XipFile *)this;
  this_local = (XipEntry *)__return_storage_ptr__;
  if (this->_rvaname == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&stack0xffffffffffffffdf);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffdf);
  }
  else {
    getrvareader((XipFile *)local_48,(uint32_t)xip,this->_rvaname);
    std::shared_ptr<ReadWriter>::shared_ptr(&local_58,(shared_ptr<ReadWriter> *)local_48);
    readstr<std::shared_ptr<ReadWriter>>(__return_storage_ptr__,&local_58);
    std::shared_ptr<ReadWriter>::~shared_ptr(&local_58);
    std::shared_ptr<ReadWriter>::~shared_ptr((shared_ptr<ReadWriter> *)local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string name(XipFile& xip)
        {
            if (_rvaname==0)
                return "";
            ReadWriter_ptr r= xip.getrvareader(_rvaname, 260);
            return readstr(r);
        }